

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_ctrlpt.c
# Opt level: O0

void searchExpired(void *arg)

{
  LISTNODE *pLVar1;
  int *__ptr;
  bool bVar2;
  Upnp_Handle_Type UVar3;
  undefined8 uStack_40;
  int found;
  void *cookie;
  Upnp_FunPtr ctrlpt_callback;
  SsdpSearchArg *item;
  ListNode *node;
  Handle_Info *ctrlpt_info;
  int handle;
  int id;
  void *arg_local;
  
  ctrlpt_info._4_4_ = *(int *)((long)arg + 4);
  ctrlpt_info._0_4_ = *arg;
  node = (ListNode *)0x0;
  uStack_40 = 0;
  bVar2 = false;
  _handle = arg;
  HandleLock(".upnp/src/ssdp/ssdp_ctrlpt.c",0x21e);
  UVar3 = GetHandleInfo((UpnpClient_Handle)ctrlpt_info,(Handle_Info **)&node);
  if (UVar3 == HND_CLIENT) {
    pLVar1 = node->next;
    for (item = (SsdpSearchArg *)ListHead((LinkedList *)&node[0x1b].next);
        item != (SsdpSearchArg *)0x0;
        item = (SsdpSearchArg *)ListNext((LinkedList *)&node[0x1b].next,(ListNode *)item)) {
      __ptr = (int *)item->cookie;
      if (*__ptr == ctrlpt_info._4_4_) {
        free(*(void **)(__ptr + 2));
        uStack_40 = *(undefined8 *)(__ptr + 4);
        bVar2 = true;
        __ptr[2] = 0;
        __ptr[3] = 0;
        free(__ptr);
        ListDelNode((LinkedList *)&node[0x1b].next,(ListNode *)item,0);
        break;
      }
    }
    HandleUnlock(".upnp/src/ssdp/ssdp_ctrlpt.c",0x235);
    if (bVar2) {
      (*(code *)pLVar1)(7,0,uStack_40);
    }
    free(_handle);
  }
  else {
    free(_handle);
    HandleUnlock(".upnp/src/ssdp/ssdp_ctrlpt.c",0x223);
  }
  return;
}

Assistant:

static void searchExpired(
	/* [in] . */
	void *arg)
{
	int id = ((SsdpSearchExpArg *)arg)->timeoutEventId;
	int handle = ((SsdpSearchExpArg *)arg)->handle;
	struct Handle_Info *ctrlpt_info = NULL;

	/* remove search Target from list and call client back */
	ListNode *node = NULL;
	SsdpSearchArg *item;
	Upnp_FunPtr ctrlpt_callback;
	void *cookie = NULL;
	int found = 0;

	HandleLock(__FILE__, __LINE__);

	/* remove search target from search list */
	if (GetHandleInfo(handle, &ctrlpt_info) != HND_CLIENT) {
		free(arg);
		HandleUnlock(__FILE__, __LINE__);
		return;
	}
	ctrlpt_callback = ctrlpt_info->Callback;
	node = ListHead(&ctrlpt_info->SsdpSearchList);
	while (node != NULL) {
		item = (SsdpSearchArg *)node->item;
		if (item->timeoutEventId == id) {
			free(item->searchTarget);
			cookie = item->cookie;
			found = 1;
			item->searchTarget = NULL;
			free(item);
			ListDelNode(&ctrlpt_info->SsdpSearchList, node, 0);
			break;
		}
		node = ListNext(&ctrlpt_info->SsdpSearchList, node);
	}
	HandleUnlock(__FILE__, __LINE__);

	if (found)
		ctrlpt_callback(UPNP_DISCOVERY_SEARCH_TIMEOUT, NULL, cookie);

	free(arg);
}